

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O3

_Bool progress_meter(GlobalConfig *global,timeval *start,_Bool final)

{
  FILE *pFVar1;
  byte bVar2;
  bool bVar3;
  timeval tVar4;
  long lVar5;
  per_transfer *ppVar6;
  long lVar7;
  long lVar8;
  curl_off_t cVar9;
  ulong uVar10;
  long lVar11;
  curl_off_t cVar12;
  char *pcVar13;
  long lVar14;
  curl_off_t cVar15;
  long lVar16;
  curl_off_t cVar17;
  timeval newer;
  timeval older;
  char ulpercen [4];
  char dlpercen [4];
  char time_total [10];
  char time_left [10];
  char buffer [3] [6];
  char time_spent [10];
  
  if (global->noprogress != false) {
    return false;
  }
  newer = tvnow();
  older.tv_usec = progress_meter_stamp_1;
  older.tv_sec = progress_meter_stamp_0;
  lVar5 = tvdiff(newer,older);
  if (progress_meter_header == '\0') {
    progress_meter_header = '\x01';
    fputs("DL% UL%  Dled  Uled  Xfers  Live   Qd Total     Current  Left    Speed\n",
          (FILE *)global->errors);
  }
  if ((!final) && (lVar5 < 0x1f5)) {
    return false;
  }
  lVar5 = tvdiff(newer,*start);
  dlpercen[0] = '-';
  dlpercen[1] = '-';
  dlpercen[2] = '\0';
  dlpercen[3] = '\0';
  ulpercen[0] = '-';
  ulpercen[1] = '-';
  ulpercen[2] = '\0';
  ulpercen[3] = '\0';
  cVar9 = all_ultotal;
  cVar12 = all_dltotal;
  cVar15 = all_dlalready;
  cVar17 = all_ulalready;
  tVar4 = newer;
  if (transfers == (per_transfer *)0x0) {
    bVar3 = true;
    lVar14 = 0;
    bVar2 = 1;
    lVar16 = 0;
  }
  else {
    bVar2 = 1;
    lVar16 = 0;
    lVar14 = 0;
    bVar3 = true;
    ppVar6 = transfers;
    do {
      progress_meter_stamp_1 = tVar4.tv_usec;
      progress_meter_stamp_0 = tVar4.tv_sec;
      if (ppVar6->dltotal == 0) {
        bVar3 = false;
      }
      else if (ppVar6->dltotal_added == false) {
        cVar12 = cVar12 + ppVar6->dltotal;
        all_dltotal = cVar12;
        ppVar6->dltotal_added = true;
        tVar4.tv_usec = progress_meter_stamp_1;
        tVar4.tv_sec = progress_meter_stamp_0;
      }
      progress_meter_stamp_1 = tVar4.tv_usec;
      progress_meter_stamp_0 = tVar4.tv_sec;
      if (ppVar6->ultotal == 0) {
        bVar2 = 0;
      }
      else if (ppVar6->ultotal_added == false) {
        cVar9 = cVar9 + ppVar6->ultotal;
        all_ultotal = cVar9;
        ppVar6->ultotal_added = true;
        tVar4.tv_usec = progress_meter_stamp_1;
        tVar4.tv_sec = progress_meter_stamp_0;
      }
      cVar15 = cVar15 + ppVar6->dlnow;
      cVar17 = cVar17 + ppVar6->ulnow;
      lVar14 = lVar14 + (ulong)ppVar6->added;
      lVar16 = lVar16 + ((ulong)ppVar6->added ^ 1);
      ppVar6 = ppVar6->next;
    } while (ppVar6 != (per_transfer *)0x0);
  }
  progress_meter_stamp_1 = tVar4.tv_usec;
  progress_meter_stamp_0 = tVar4.tv_sec;
  if ((bVar3) && (cVar12 != 0)) {
    curl_msnprintf(dlpercen,4,"%3ld",(cVar15 * 100) / cVar12);
    tVar4.tv_usec = progress_meter_stamp_1;
    tVar4.tv_sec = progress_meter_stamp_0;
    cVar9 = all_ultotal;
  }
  progress_meter_stamp_1 = tVar4.tv_usec;
  progress_meter_stamp_0 = tVar4.tv_sec;
  if ((bool)(bVar2 & cVar9 != 0)) {
    curl_msnprintf(ulpercen,4,"%3ld",(cVar17 * 100) / cVar9);
    tVar4.tv_usec = progress_meter_stamp_1;
    tVar4.tv_sec = progress_meter_stamp_0;
  }
  progress_meter_stamp_1 = tVar4.tv_usec;
  progress_meter_stamp_0 = tVar4.tv_sec;
  uVar10 = (ulong)speedindex;
  speedindex = speedindex + 1;
  speedstore[uVar10].dl = cVar15;
  speedstore[uVar10].ul = cVar17;
  speedstore[uVar10].stamp = newer;
  if (speedindex < 10) {
    if (indexwrapped != '\x01') {
      lVar7 = tvdiff(newer,*start);
      lVar11 = cVar17;
      lVar8 = cVar15;
      goto LAB_00119bc2;
    }
  }
  else {
    indexwrapped = '\x01';
    speedindex = 0;
  }
  lVar7 = tvdiff(newer,speedstore[speedindex].stamp);
  lVar11 = cVar17 - speedstore[speedindex].ul;
  lVar8 = cVar15 - speedstore[speedindex].dl;
LAB_00119bc2:
  lVar8 = (long)((double)lVar8 / ((double)lVar7 / 1000.0));
  lVar11 = (long)((double)lVar11 / ((double)lVar7 / 1000.0));
  if (lVar11 < lVar8) {
    lVar11 = lVar8;
  }
  if ((bool)(bVar3 & lVar11 != 0)) {
    lVar8 = all_dltotal / lVar11;
    time2str(time_left,(all_dltotal - cVar15) / lVar11);
    time2str(time_total,lVar8);
  }
  else {
    builtin_strncpy(time_left,"--:--:--",9);
    builtin_strncpy(time_total,"--:--:--",9);
  }
  time2str(time_spent,lVar5 / 1000);
  pFVar1 = global->errors;
  max5data(cVar15,buffer[0]);
  max5data(cVar17,buffer[1]);
  cVar9 = all_xfers;
  max5data(lVar11,buffer[2]);
  pcVar13 = "";
  if (final) {
    pcVar13 = "\n";
  }
  curl_mfprintf(pFVar1,"\r%-3s %-3s %s %s %5ld %5ld %5ld %s %s %s %s %5s",dlpercen,ulpercen,buffer,
                buffer + 1,cVar9,lVar14,lVar16,time_total,time_spent,time_left,buffer + 2,pcVar13);
  return true;
}

Assistant:

bool progress_meter(struct GlobalConfig *global,
                    struct timeval *start,
                    bool final)
{
  static struct timeval stamp;
  static bool header = FALSE;
  struct timeval now;
  long diff;

  if(global->noprogress)
    return FALSE;

  now = tvnow();
  diff = tvdiff(now, stamp);

  if(!header) {
    header = TRUE;
    fputs("DL% UL%  Dled  Uled  Xfers  Live   Qd "
          "Total     Current  Left    Speed\n",
          global->errors);
  }
  if(final || (diff > 500)) {
    char time_left[10];
    char time_total[10];
    char time_spent[10];
    char buffer[3][6];
    curl_off_t spent = tvdiff(now, *start)/1000;
    char dlpercen[4]="--";
    char ulpercen[4]="--";
    struct per_transfer *per;
    curl_off_t all_dlnow = 0;
    curl_off_t all_ulnow = 0;
    bool dlknown = TRUE;
    bool ulknown = TRUE;
    curl_off_t all_running = 0; /* in progress */
    curl_off_t all_queued = 0;  /* pending */
    curl_off_t speed = 0;
    unsigned int i;
    stamp = now;

    /* first add the amounts of the already completed transfers */
    all_dlnow += all_dlalready;
    all_ulnow += all_ulalready;

    for(per = transfers; per; per = per->next) {
      all_dlnow += per->dlnow;
      all_ulnow += per->ulnow;
      if(!per->dltotal)
        dlknown = FALSE;
      else if(!per->dltotal_added) {
        /* only add this amount once */
        all_dltotal += per->dltotal;
        per->dltotal_added = TRUE;
      }
      if(!per->ultotal)
        ulknown = FALSE;
      else if(!per->ultotal_added) {
        /* only add this amount once */
        all_ultotal += per->ultotal;
        per->ultotal_added = TRUE;
      }
      if(!per->added)
        all_queued++;
      else
        all_running++;
    }
    if(dlknown && all_dltotal)
      /* TODO: handle integer overflow */
      msnprintf(dlpercen, sizeof(dlpercen), "%3" CURL_FORMAT_CURL_OFF_T,
                all_dlnow * 100 / all_dltotal);
    if(ulknown && all_ultotal)
      /* TODO: handle integer overflow */
      msnprintf(ulpercen, sizeof(ulpercen), "%3" CURL_FORMAT_CURL_OFF_T,
                all_ulnow * 100 / all_ultotal);

    /* get the transfer speed, the higher of the two */

    i = speedindex;
    speedstore[i].dl = all_dlnow;
    speedstore[i].ul = all_ulnow;
    speedstore[i].stamp = now;
    if(++speedindex >= SPEEDCNT) {
      indexwrapped = TRUE;
      speedindex = 0;
    }

    {
      long deltams;
      curl_off_t dl;
      curl_off_t ul;
      curl_off_t dls;
      curl_off_t uls;
      if(indexwrapped) {
        /* 'speedindex' is the oldest stored data */
        deltams = tvdiff(now, speedstore[speedindex].stamp);
        dl = all_dlnow - speedstore[speedindex].dl;
        ul = all_ulnow - speedstore[speedindex].ul;
      }
      else {
        /* since the beginning */
        deltams = tvdiff(now, *start);
        dl = all_dlnow;
        ul = all_ulnow;
      }
      dls = (curl_off_t)((double)dl / ((double)deltams/1000.0));
      uls = (curl_off_t)((double)ul / ((double)deltams/1000.0));
      speed = dls > uls ? dls : uls;
    }


    if(dlknown && speed) {
      curl_off_t est = all_dltotal / speed;
      curl_off_t left = (all_dltotal - all_dlnow) / speed;
      time2str(time_left, left);
      time2str(time_total, est);
    }
    else {
      time2str(time_left, 0);
      time2str(time_total, 0);
    }
    time2str(time_spent, spent);

    fprintf(global->errors,
            "\r"
            "%-3s " /* percent downloaded */
            "%-3s " /* percent uploaded */
            "%s " /* Dled */
            "%s " /* Uled */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Xfers */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Live */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Queued */
            "%s "  /* Total time */
            "%s "  /* Current time */
            "%s "  /* Time left */
            "%s "  /* Speed */
            "%5s" /* final newline */,

            dlpercen,  /* 3 letters */
            ulpercen,  /* 3 letters */
            max5data(all_dlnow, buffer[0]),
            max5data(all_ulnow, buffer[1]),
            all_xfers,
            all_running,
            all_queued,
            time_total,
            time_spent,
            time_left,
            max5data(speed, buffer[2]), /* speed */
            final ? "\n" :"");
    return TRUE;
  }
  return FALSE;
}